

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O2

VariableIndex __thiscall
dynet::ComputationGraph::add_function<dynet::FlipGradient>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments)

{
  Node *pNVar1;
  Device **ppDVar2;
  VariableIndex new_node_index;
  Node *local_20;
  
  new_node_index =
       (VariableIndex)
       ((ulong)((long)(this->nodes).
                      super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  pNVar1 = (Node *)operator_new(0x60);
  FlipGradient::FlipGradient((FlipGradient *)pNVar1,arguments);
  local_20 = pNVar1;
  std::vector<dynet::Node*,std::allocator<dynet::Node*>>::emplace_back<dynet::Node*>
            ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,&local_20);
  pNVar1 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  if (pNVar1->device == (Device *)0x0) {
    if (arguments->_M_len == 0) {
      ppDVar2 = (Device **)&dynet::default_device;
    }
    else {
      ppDVar2 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[*arguments->_M_array]->device;
    }
    pNVar1->device = *ppDVar2;
  }
  set_dim_for_new_node(this,&new_node_index);
  return new_node_index;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}